

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

void cleanup_mon_spell(void)

{
  monster_spell *pmVar1;
  monster_spell_level *pmVar2;
  monster_spell *p;
  monster_spell_level *p_00;
  
  p = monster_spells;
  while (p != (monster_spell *)0x0) {
    pmVar1 = p->next;
    p_00 = p->level;
    free_effect(p->effect);
    while (p_00 != (monster_spell_level *)0x0) {
      pmVar2 = p_00->next;
      string_free(p_00->lore_desc);
      string_free(p_00->message);
      string_free(p_00->blind_message);
      string_free(p_00->miss_message);
      string_free(p_00->save_message);
      mem_free(p_00);
      p_00 = pmVar2;
    }
    mem_free(p);
    p = pmVar1;
  }
  return;
}

Assistant:

static void cleanup_mon_spell(void)
{
	struct monster_spell *rs = monster_spells;
	struct monster_spell *next;
	struct monster_spell_level *level;

	while (rs) {
		next = rs->next;
		level = rs->level;
		free_effect(rs->effect);
		while (level) {
			struct monster_spell_level *next_level = level->next;
			string_free(level->lore_desc);
			string_free(level->message);
			string_free(level->blind_message);
			string_free(level->miss_message);
			string_free(level->save_message);
			mem_free(level);
			level = next_level;
		}
		mem_free(rs);
		rs = next;
	}
}